

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_kv_cursor_init(unqlite *pDb,unqlite_kv_cursor **ppOut)

{
  uint uVar1;
  unqlite_kv_methods *puVar2;
  uint nByte;
  int iVar3;
  unqlite_kv_cursor *puVar4;
  unqlite_kv_cursor *puVar5;
  unqlite_kv_cursor *puVar6;
  unqlite_kv_cursor *puVar7;
  
  if (((pDb == (unqlite *)0x0) || (ppOut == (unqlite_kv_cursor **)0x0)) ||
     (pDb->nMagic != 0xdb7c2712)) {
    return -0x18;
  }
  puVar2 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
  uVar1 = puVar2->szCursor;
  if ((int)uVar1 < 1) {
    unqliteGenErrorFormat(pDb,"Storage engine \'%s\' does not support cursors",puVar2->zName);
    iVar3 = -0x11;
  }
  else {
    nByte = uVar1 | 8;
    if (7 < uVar1) {
      nByte = uVar1;
    }
    puVar4 = (unqlite_kv_cursor *)SyMemBackendPoolAlloc(&pDb->sMem,nByte);
    if (puVar4 == (unqlite_kv_cursor *)0x0) {
      unqliteGenError(pDb,"unQLite is running out of memory");
      iVar3 = -1;
    }
    else {
      puVar5 = (unqlite_kv_cursor *)((long)&puVar4->pStore + (ulong)nByte);
      puVar6 = puVar4;
      do {
        *(undefined1 *)&puVar6->pStore = 0;
        puVar7 = (unqlite_kv_cursor *)((long)&puVar6->pStore + 1);
        if (puVar5 <= puVar7) break;
        *(undefined1 *)&puVar7->pStore = 0;
        puVar7 = (unqlite_kv_cursor *)((long)&puVar6->pStore + 2);
        if (puVar5 <= puVar7) break;
        *(undefined1 *)&puVar7->pStore = 0;
        puVar7 = (unqlite_kv_cursor *)((long)&puVar6->pStore + 3);
        if (puVar5 <= puVar7) break;
        *(undefined1 *)&puVar7->pStore = 0;
        puVar6 = (unqlite_kv_cursor *)((long)&puVar6->pStore + 4);
      } while (puVar6 < puVar5);
      puVar4->pStore = ((pDb->sDB).pPager)->pEngine;
      if (puVar2->xCursorInit != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
        (*puVar2->xCursorInit)(puVar4);
      }
      *ppOut = puVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int unqlite_kv_cursor_init(unqlite *pDb,unqlite_kv_cursor **ppOut)
{
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0 /* Noop */){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Allocate a new cursor */
	 rc = unqliteInitCursor(pDb,ppOut);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	 return rc;
}